

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt64
          (OptionInterpreter *this,int number,int64_t value,Type type,
          UnknownFieldSet *unknown_fields)

{
  uint64_t value_00;
  LogMessage *pLVar1;
  LogMessageFatal local_48 [23];
  Voidify local_31;
  UnknownFieldSet *local_30;
  UnknownFieldSet *unknown_fields_local;
  int64_t iStack_20;
  Type type_local;
  int64_t value_local;
  OptionInterpreter *pOStack_10;
  int number_local;
  OptionInterpreter *this_local;
  
  local_30 = unknown_fields;
  unknown_fields_local._4_4_ = type;
  iStack_20 = value;
  value_local._4_4_ = number;
  pOStack_10 = this;
  if (type == TYPE_INT64) {
    UnknownFieldSet::AddVarint(unknown_fields,number,value);
  }
  else if (type == TYPE_SFIXED64) {
    UnknownFieldSet::AddFixed64(unknown_fields,number,value);
  }
  else {
    if (type != MAX_TYPE) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                 ,0x254b);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [38])"Invalid wire type for CPPTYPE_INT64: ");
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::
               operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                         (pLVar1,(Type *)((long)&unknown_fields_local + 4));
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar1);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
    }
    value_00 = internal::WireFormatLite::ZigZagEncode64(value);
    UnknownFieldSet::AddVarint(unknown_fields,number,value_00);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt64(
    int number, int64_t value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT64:
      unknown_fields->AddVarint(number, static_cast<uint64_t>(value));
      break;

    case FieldDescriptor::TYPE_SFIXED64:
      unknown_fields->AddFixed64(number, static_cast<uint64_t>(value));
      break;

    case FieldDescriptor::TYPE_SINT64:
      unknown_fields->AddVarint(
          number, internal::WireFormatLite::ZigZagEncode64(value));
      break;

    default:
      ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT64: " << type;
      break;
  }
}